

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.hpp
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
openjij::utility::gen_matrix_from_trotter_spins<double,0>
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,utility *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *trotter_spins)

{
  ulong rows;
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  Matrix<double,__1,__1,_0,__1,__1> *pMVar6;
  undefined8 *puVar7;
  ulong cols;
  long lVar8;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar9;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  plVar1 = *(long **)this;
  plVar2 = *(long **)(this + 8);
  lVar8 = plVar1[1] - *plVar1 >> 2;
  rows = lVar8 + 1;
  cols = ((long)plVar2 - (long)plVar1 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  if ((long)(cols | rows) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if (((plVar2 != plVar1) && (rows != 0)) &&
     (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar5 / SEXT816((long)cols),0) <= lVar8)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8,lVar8,SUB168(auVar5 % SEXT816((long)cols),0));
    *puVar7 = dup2;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,cols * rows,rows,cols);
  plVar1 = *(long **)this;
  plVar2 = *(long **)(this + 8);
  pMVar6 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (((long)plVar2 - (long)plVar1 >> 3) * -0x5555555555555555);
  if (plVar2 != plVar1) {
    lVar8 = 0;
    pMVar9 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    do {
      lVar3 = plVar1[(long)pMVar9 * 3];
      lVar11 = plVar1[(long)pMVar9 * 3 + 1] - lVar3;
      if (lVar11 != 0) {
        if ((long)pMVar9 < 0) goto LAB_0013e2f5;
        lVar11 = lVar11 >> 2;
        lVar4 = (__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
        lVar12 = 0;
        if (0 < lVar4) {
          lVar12 = lVar4;
        }
        lVar13 = 0;
        do {
          if ((lVar12 == lVar13) ||
             ((__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols <=
              (long)pMVar9)) goto LAB_0013e2f5;
          *(double *)
           ((long)(__return_storage_ptr__->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
           + lVar13 * 8 + lVar4 * lVar8) = (double)*(int *)(lVar3 + lVar13 * 4);
          lVar13 = lVar13 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
      }
      pMVar9 = (Matrix<double,__1,__1,_0,__1,__1> *)
               ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data + 1);
      lVar8 = lVar8 + 8;
    } while (pMVar9 != pMVar6);
  }
  if (plVar2 != plVar1) {
    lVar8 = plVar1[1] - *plVar1 >> 2;
    if ((lVar8 < 0) ||
       (lVar3 = (__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows,
       lVar3 <= lVar8)) {
LAB_0013e2f5:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                   );
    }
    pMVar9 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (__return_storage_ptr__->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    pMVar10 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    if ((long)pMVar9 < 1) {
      pMVar9 = pMVar10;
    }
    pMVar6 = (Matrix<double,__1,__1,_0,__1,__1> *)
             ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + (ulong)(pMVar6 == (Matrix<double,__1,__1,_0,__1,__1> *)0x0))
    ;
    lVar8 = lVar8 << 3;
    do {
      if (pMVar9 == pMVar10) goto LAB_0013e2f5;
      *(undefined8 *)
       ((long)(__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
       lVar8) = 0x3ff0000000000000;
      pMVar10 = (Matrix<double,__1,__1,_0,__1,__1> *)
                ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data + 1);
      lVar8 = lVar8 + lVar3 * 8;
    } while (pMVar6 != pMVar10);
  }
  return pMVar6;
}

Assistant:

inline static Eigen::Matrix<FloatType, Eigen::Dynamic, Eigen::Dynamic, Options>
gen_matrix_from_trotter_spins(const std::vector<graph::Spins> &trotter_spins) {
  Eigen::Matrix<FloatType, Eigen::Dynamic, Eigen::Dynamic, Options> ret_mat(
      trotter_spins[0].size() + 1, trotter_spins.size());

  // initialize spin
  for (size_t j = 0; j < trotter_spins.size(); j++) {
    for (size_t i = 0; i < trotter_spins[j].size(); i++) {
      ret_mat(i, j) = trotter_spins[j][i];
    }
  }

  // dummy spins
  for (size_t j = 0; j < trotter_spins.size(); j++) {
    ret_mat(trotter_spins[0].size(), j) = 1;
  }

  return ret_mat;
}